

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginGroup(void)

{
  ImGuiWindow *pIVar1;
  ImGuiGroupData *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  ImGuiContext *g;
  float fVar6;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  ImVector<ImGuiGroupData>::resize(&(pIVar1->DC).GroupStack,(pIVar1->DC).GroupStack.Size + 1);
  pIVar2 = (pIVar1->DC).GroupStack.Data;
  lVar5 = (long)(pIVar1->DC).GroupStack.Size;
  pIVar2[lVar5 + -1].BackupCursorPos = (pIVar1->DC).CursorPos;
  pIVar2[lVar5 + -1].BackupCursorMaxPos = (pIVar1->DC).CursorMaxPos;
  pIVar2[lVar5 + -1].BackupIndent.x = (pIVar1->DC).Indent.x;
  pIVar2[lVar5 + -1].BackupGroupOffset.x = (pIVar1->DC).GroupOffset.x;
  pIVar2[lVar5 + -1].BackupCurrentLineSize = (pIVar1->DC).CurrentLineSize;
  pIVar2[lVar5 + -1].BackupCurrentLineTextBaseOffset = (pIVar1->DC).CurrentLineTextBaseOffset;
  pIVar2[lVar5 + -1].BackupLogLinePosY = (pIVar1->DC).LogLinePosY;
  pIVar2[lVar5 + -1].BackupActiveIdIsAlive = pIVar4->ActiveIdIsAlive;
  pIVar2[lVar5 + -1].BackupActiveIdPreviousFrameIsAlive = pIVar4->ActiveIdPreviousFrameIsAlive;
  pIVar2[lVar5 + -1].AdvanceCursor = true;
  fVar6 = ((pIVar1->DC).CursorPos.x - (pIVar1->Pos).x) - (pIVar1->DC).ColumnsOffset.x;
  (pIVar1->DC).GroupOffset.x = fVar6;
  (pIVar1->DC).Indent.x = fVar6;
  IVar3 = (pIVar1->DC).CursorPos;
  (pIVar1->DC).CursorMaxPos = IVar3;
  (pIVar1->DC).CurrentLineSize.x = 0.0;
  (pIVar1->DC).CurrentLineSize.y = 0.0;
  (pIVar1->DC).LogLinePosY = IVar3.y + -9999.0;
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    window->DC.GroupStack.resize(window->DC.GroupStack.Size + 1);
    ImGuiGroupData& group_data = window->DC.GroupStack.back();
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrentLineSize = window->DC.CurrentLineSize;
    group_data.BackupCurrentLineTextBaseOffset = window->DC.CurrentLineTextBaseOffset;
    group_data.BackupLogLinePosY = window->DC.LogLinePosY;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.AdvanceCursor = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrentLineSize = ImVec2(0.0f, 0.0f);
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f; // To enforce Log carriage return
}